

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

config_value * parser_parse_value(parser *parser,char *value)

{
  parser_token pVar1;
  natwm_error nVar2;
  int iVar3;
  char *pcVar4;
  size_t sVar5;
  map_entry *pmVar6;
  config_value *pcVar7;
  char **ppcVar8;
  long *plVar9;
  char **ppcVar10;
  char *pcVar11;
  size_t sVar12;
  undefined8 in_R9;
  parser *ppVar13;
  config_value *pcVar14;
  undefined8 *puVar15;
  config_value *pcVar16;
  bool bVar17;
  undefined8 uVar18;
  size_t local_68;
  size_t array_string_length;
  char *array_string;
  size_t raw_string_length;
  char **local_48;
  parser *local_40;
  char **local_38;
  char *array_value_items_string;
  
  uVar18 = 0x106e14;
  local_40 = parser;
  pVar1 = char_to_token(*value);
  ppVar13 = local_40;
  switch(pVar1) {
  case ALPHA_CHAR:
    local_38 = (char **)((ulong)local_38 & 0xffffffffffffff00);
    nVar2 = string_to_boolean(value,(_Bool *)&local_38);
    if (nVar2 != NO_ERROR) {
      sVar12 = local_40->line_num;
      pcVar11 = "Invalid boolean value \'%s\' found - Line %zu";
LAB_00106ffe:
      internal_logger(natwm_logger,LEVEL_ERROR,pcVar11,value,sVar12,in_R9,uVar18);
      return (config_value *)0x0;
    }
    pcVar7 = config_value_create_boolean(local_38._0_1_);
    break;
  case ARRAY_START:
    sVar5 = strlen(value);
    pVar1 = char_to_token(value[sVar5 - 1]);
    ppVar13 = local_40;
    if (pVar1 == ARRAY_END) {
      pcVar4 = string_init(value);
LAB_001070b5:
      local_38 = (char **)0x0;
      local_48 = (char **)0x0;
      array_string = (char *)0x0;
      sVar5 = strlen(pcVar4);
      nVar2 = string_splice(pcVar4,1,sVar5 - 1,(char **)&local_38,(size_t *)&array_string);
      free(pcVar4);
      bVar17 = nVar2 == NO_ERROR;
      if (bVar17) {
        local_48 = local_38;
      }
    }
    else {
      pcVar11 = (char *)0x0;
      local_38 = (char **)0x0;
      array_string = (char *)0x0;
      nVar2 = array_context_get_delimiter
                        (local_40->buffer + local_40->pos,']',(char **)&local_38,
                         (size_t *)&array_string,true);
      ppcVar8 = local_38;
      pcVar4 = (char *)0x0;
      if (nVar2 == NO_ERROR) {
        array_string_length = 0;
        local_68 = 0;
        nVar2 = string_strip_surrounding_spaces
                          ((char *)local_38,(char **)&array_string_length,&local_68);
        free(ppcVar8);
        pcVar11 = (char *)0x0;
        bVar17 = nVar2 == NO_ERROR;
        ppVar13 = local_40;
        if (bVar17) {
          pcVar11 = array_string + -1;
          pcVar4 = (char *)array_string_length;
        }
      }
      else {
        bVar17 = false;
      }
      if (bVar17) {
        for (; pcVar11 != (char *)0x0; pcVar11 = pcVar11 + -1) {
          parser_increment(ppVar13);
        }
      }
      else {
        internal_logger(natwm_logger,LEVEL_ERROR,
                        "Could not find \']\' in array value string - Line %zu",ppVar13->line_num);
      }
      if (bVar17) goto LAB_001070b5;
      local_48 = (char **)0x0;
      bVar17 = false;
    }
    if (!bVar17) {
      return (config_value *)0x0;
    }
    raw_string_length = (size_t)list_create();
    if ((list *)raw_string_length == (list *)0x0) {
      ppcVar8 = (char **)0x0;
      pcVar7 = (config_value *)0x0;
      bVar17 = false;
      ppVar13 = local_40;
    }
    else {
      ppcVar8 = local_48;
      do {
        local_38 = (char **)0x0;
        array_string = (char *)0x0;
        nVar2 = array_context_get_delimiter
                          ((char *)ppcVar8,',',(char **)&local_38,(size_t *)&array_string,false);
        if (nVar2 == NO_ERROR) {
          list_insert((list *)raw_string_length,local_38);
          ppcVar8 = (char **)((char *)((long)ppcVar8 + (long)array_string) + 1);
          iVar3 = 0;
        }
        else {
          iVar3 = 4;
          if ((nVar2 == NOT_FOUND_ERROR) &&
             (pcVar11 = string_init((char *)ppcVar8), pcVar11 != (char *)0x0)) {
            list_insert((list *)raw_string_length,pcVar11);
            iVar3 = 2;
          }
        }
        ppVar13 = local_40;
      } while (iVar3 == 0);
      if (iVar3 == 4) {
LAB_00107200:
        for (puVar15 = *(undefined8 **)raw_string_length; puVar15 != (undefined8 *)0x0;
            puVar15 = (undefined8 *)*puVar15) {
          if ((void *)puVar15[2] != (void *)0x0) {
            free((void *)puVar15[2]);
          }
        }
        ppcVar8 = (char **)0x0;
        pcVar7 = (config_value *)0x0;
        bVar17 = false;
      }
      else {
        pcVar7 = *(config_value **)(raw_string_length + 0x10);
        ppcVar8 = (char **)malloc((long)pcVar7 * 8);
        if (ppcVar8 == (char **)0x0) goto LAB_00107200;
        plVar9 = *(long **)raw_string_length;
        bVar17 = true;
        if (plVar9 != (long *)0x0) {
          ppcVar10 = ppcVar8 + (long)pcVar7;
          do {
            ppcVar10 = ppcVar10 + -1;
            *ppcVar10 = (char *)plVar9[2];
            plVar9 = (long *)*plVar9;
          } while (plVar9 != (long *)0x0);
        }
      }
      list_destroy((list *)raw_string_length);
    }
    if (bVar17) {
      iVar3 = 2;
      pcVar14 = pcVar7;
      if (pcVar7 != (config_value *)0x0) {
        pcVar14 = (config_value *)0x0;
        do {
          local_38 = (char **)0x0;
          nVar2 = string_strip_surrounding_spaces
                            (ppcVar8[(long)pcVar14],(char **)&local_38,(size_t *)0x0);
          if (nVar2 == NO_ERROR) {
            free(ppcVar8[(long)pcVar14]);
            ppcVar8[(long)pcVar14] = (char *)local_38;
            iVar3 = 0;
            bVar17 = true;
          }
          else if ((nVar2 == NOT_FOUND_ERROR) &&
                  (pcVar16 = (config_value *)((long)&pcVar7[-1].data + 7), pcVar14 == pcVar16)) {
            free(ppcVar8[(long)pcVar14]);
            iVar3 = 2;
            bVar17 = false;
            pcVar7 = pcVar16;
          }
          else {
            bVar17 = false;
            internal_logger(natwm_logger,LEVEL_ERROR,
                            "Failed to parse array value item \'%s\' - Line %zu",
                            ppcVar8[(long)pcVar14],local_40->line_num);
            iVar3 = 5;
          }
          if (!bVar17) goto LAB_00107303;
          pcVar14 = (config_value *)((long)&pcVar14->type + 1);
        } while (pcVar14 < pcVar7);
        iVar3 = 2;
      }
LAB_00107303:
      if (iVar3 != 5) {
        if (iVar3 != 2) {
          return pcVar14;
        }
        pcVar7 = parser_resolve_array_values(local_40,ppcVar8,(size_t)pcVar7);
        if (pcVar7 != (config_value *)0x0) {
          free(value);
          free(local_48);
          value = (char *)ppcVar8;
          goto LAB_00107069;
        }
      }
      free(local_48);
LAB_0010737c:
      free(ppcVar8);
      return (config_value *)0x0;
    }
    pcVar7 = (config_value *)0x0;
    internal_logger(natwm_logger,LEVEL_ERROR,"Failed to parse array value items string - Line %zu",
                    ppVar13->line_num);
    value = (char *)local_48;
    goto LAB_00107069;
  default:
    goto switchD_00106e38_caseD_2;
  case NUMERIC_CHAR:
    local_38 = (char **)0x0;
    nVar2 = string_to_number(value,(intmax_t *)&local_38);
    if (nVar2 != NO_ERROR) {
      sVar12 = local_40->line_num;
      pcVar11 = "Invalid numeric value \'%s\' found - Line %zu";
      goto LAB_00106ffe;
    }
    pcVar7 = config_value_create_number((intmax_t)local_38);
    break;
  case QUOTE:
    sVar5 = strlen(value);
    local_38 = (char **)0x0;
    nVar2 = string_splice(value,1,sVar5 - 1,(char **)&local_38,(size_t *)0x0);
    if (nVar2 != NO_ERROR) {
      sVar12 = local_40->line_num;
      pcVar11 = "Invalid string \'%s\' found - Line %zu";
      goto LAB_00106ffe;
    }
    pcVar7 = config_value_create_string((char *)local_38);
    ppcVar8 = local_38;
    if (pcVar7 == (config_value *)0x0) goto LAB_0010737c;
    goto LAB_00107069;
  case VARIABLE_START:
    pmVar6 = map_get(local_40->variables,value + 1);
    if (pmVar6 == (map_entry *)0x0) {
      pcVar7 = (config_value *)0x0;
    }
    else {
      pcVar7 = (config_value *)pmVar6->value;
    }
    if (pcVar7 == (config_value *)0x0) {
      pcVar11 = "\'%s\' is not defined - Line: %zu";
    }
    else {
      pcVar7 = config_value_duplicate(pcVar7);
      if (pcVar7 != (config_value *)0x0) break;
      pcVar11 = "Failed to resolve variable \'%s\' - Line: %zu";
      ppVar13 = local_40;
    }
    pcVar7 = (config_value *)0x0;
    internal_logger(natwm_logger,LEVEL_ERROR,pcVar11,value + 1,ppVar13->line_num,in_R9,uVar18);
  }
  if (pcVar7 == (config_value *)0x0) {
switchD_00106e38_caseD_2:
    return (config_value *)0x0;
  }
LAB_00107069:
  free(value);
  return pcVar7;
}

Assistant:

struct config_value *parser_parse_value(struct parser *parser, char *value)
{
        switch (char_to_token(value[0])) {
        case ALPHA_CHAR:
                return parser_parse_boolean(parser, value);
        case ARRAY_START:
                return parser_parse_array(parser, value);
        case NUMERIC_CHAR:
                return parser_parse_number(parser, value);
        case QUOTE:
                return parser_parse_string(parser, value);
        case VARIABLE_START:
                return parser_parse_variable(parser, value);
        default:
                return NULL;
        }
}